

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::LogFreePartiallyDecommittedPageSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment)

{
  size_t *psVar1;
  uint uVar2;
  size_t sVar3;
  PageMemoryData *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar2 = pageSegment->decommitPageCount;
  this->committedBytes = this->committedBytes + (ulong)(uVar2 << 0xc);
  if (this->memoryData != (PageMemoryData *)0x0) {
    psVar1 = &this->memoryData->currentCommittedPageCount;
    *psVar1 = *psVar1 + (ulong)uVar2;
    LogFreeSegment(this,&pageSegment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    return;
  }
  sVar3 = (pageSegment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount;
  auVar6._8_4_ = (int)sVar3;
  auVar6._0_8_ = sVar3;
  auVar6._12_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3 * 0x1000;
  auVar5._8_8_ = auVar6._8_8_ * 0x1000;
  this->reservedBytes = this->reservedBytes + sVar3 * -0x1000;
  this->committedBytes = this->committedBytes + auVar6._8_8_ * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar4 = this->memoryData;
  if (pPVar4 != (PageMemoryData *)0x0) {
    auVar6 = pmovsxbq(auVar5,0x101);
    pPVar4->releaseSegmentCount = auVar6._0_8_ + pPVar4->releaseSegmentCount;
    pPVar4->releaseSegmentBytes = sVar3 * 0x1000 + pPVar4->releaseSegmentBytes;
    pPVar4->currentCommittedPageCount = pPVar4->currentCommittedPageCount - sVar3;
  }
  return;
}

Assistant:

uint GetDecommitPageCount() const { return decommitPageCount; }